

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O3

void __thiscall
ParsedSRTTrackData::extractData(ParsedSRTTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  size_t __n;
  int iVar3;
  uint8_t *__dest;
  undefined1 *puVar4;
  int *x;
  string postfix;
  string prefix;
  string local_70;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  iVar3 = this->m_packetCnt;
  x = &this->m_packetCnt;
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x20a1f5);
    iVar3 = *x;
  }
  *x = iVar3 + 1;
  int32ToStr_abi_cxx11_(&local_70,x);
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_50);
  floatToTime_abi_cxx11_(&local_70,(double)pkt->pts / 5292000000.0,',');
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_50);
  floatToTime_abi_cxx11_(&local_70,(double)(pkt->duration + pkt->pts) / 5292000000.0,',');
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::push_back((char)&local_50);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\n\n","");
  __n = local_48;
  iVar3 = size + (int)local_48 + (int)local_70._M_string_length;
  pkt->size = iVar3;
  __dest = (uint8_t *)operator_new__((long)iVar3);
  puVar4 = local_50;
  pkt->data = __dest;
  memcpy(__dest,local_50,__n);
  memcpy(__dest + __n,buff,(long)size);
  _Var2._M_p = local_70._M_dataplus._M_p;
  memcpy(__dest + __n + size,local_70._M_dataplus._M_p,local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != &local_70.field_2) {
    operator_delete(_Var2._M_p,local_70.field_2._M_allocated_capacity + 1);
    puVar4 = local_50;
  }
  if (puVar4 != &local_40) {
    operator_delete(puVar4,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void ParsedSRTTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    std::string prefix;
    if (m_packetCnt == 0)
        prefix = "\xEF\xBB\xBF";  // UTF-8 header
    prefix += int32ToStr(++m_packetCnt);
    prefix += "\n";
    prefix += floatToTime(static_cast<double>(pkt->pts) / INTERNAL_PTS_FREQ, ',');
    prefix += " --> ";
    prefix += floatToTime(static_cast<double>(pkt->pts + pkt->duration) / INTERNAL_PTS_FREQ, ',');
    prefix += '\n';
    const std::string postfix = "\n\n";
    pkt->size = static_cast<int>(size + prefix.length() + postfix.length());
    pkt->data = new uint8_t[pkt->size];
    memcpy(pkt->data, prefix.c_str(), prefix.length());
    memcpy(pkt->data + prefix.length(), buff, size);
    memcpy(pkt->data + prefix.length() + size, postfix.c_str(), postfix.length());
}